

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber_link.cpp
# Opt level: O0

string * __thiscall miniros::SubscriberLink::getMD5Sum_abi_cxx11_(SubscriberLink *this)

{
  element_type *this_00;
  string *psVar1;
  PublicationPtr parent;
  weak_ptr<miniros::Publication> *in_stack_ffffffffffffffd8;
  
  std::weak_ptr<miniros::Publication>::lock(in_stack_ffffffffffffffd8);
  this_00 = std::__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4cf219);
  psVar1 = Publication::getMD5Sum_abi_cxx11_(this_00);
  std::shared_ptr<miniros::Publication>::~shared_ptr((shared_ptr<miniros::Publication> *)0x4cf232);
  return psVar1;
}

Assistant:

const std::string& SubscriberLink::getMD5Sum()
{
  PublicationPtr parent = parent_.lock();
  return parent->getMD5Sum();
}